

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectrum_test.cpp
# Opt level: O2

void __thiscall Spectrum_Blackbody_Test::TestBody(Spectrum_Blackbody_Test *this)

{
  float fVar1;
  long lVar2;
  char *pcVar3;
  undefined1 auVar4 [16];
  Float FVar5;
  float T;
  float local_60 [2];
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58;
  AssertionResult gtest_ar;
  
  for (lVar2 = 8; lVar2 != 0x38; lVar2 = lVar2 + 0xc) {
    fVar1 = *(float *)((long)&DAT_00589f20 + lVar2);
    FVar5 = pbrt::Blackbody(*(Float *)(&UNK_00589f18 + lVar2),*(Float *)(&UNK_00589f1c + lVar2));
    local_58.ptr_ =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         0x3f50624dd2f1a9fc;
    auVar4._8_4_ = 0x7fffffff;
    auVar4._0_8_ = 0x7fffffff7fffffff;
    auVar4._12_4_ = 0x7fffffff;
    auVar4 = vandps_avx512vl(ZEXT416((uint)(FVar5 - fVar1)),auVar4);
    local_60[0] = auVar4._0_4_ / fVar1;
    testing::internal::CmpHelperLT<float,double>
              ((internal *)&gtest_ar,"err(Blackbody(lambda, T), LeExpected)",".001",local_60,
               (double *)&local_58);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_58);
      pcVar3 = "";
      if (gtest_ar.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_60,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/spectrum_test.cpp"
                 ,0x24,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_60,(Message *)&local_58);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_60);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr(&local_58);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
  }
  for (lVar2 = 0; lVar2 != 0x14; lVar2 = lVar2 + 4) {
    T = (float)*(int *)((long)&DAT_00589f50 + lVar2);
    fVar1 = (0.002897772 / (float)*(int *)((long)&DAT_00589f50 + lVar2)) * 1e+09;
    FVar5 = pbrt::Blackbody(fVar1 * 0.999,T);
    local_58.ptr_._0_4_ = FVar5;
    local_60[0] = pbrt::Blackbody(fVar1,T);
    testing::internal::CmpHelperLT<float,float>
              ((internal *)&gtest_ar,"Blackbody(lambda[0], T)","Blackbody(lambda[1], T)",
               (float *)&local_58,local_60);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_58);
      pcVar3 = "";
      if (gtest_ar.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_60,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/spectrum_test.cpp"
                 ,0x2d,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_60,(Message *)&local_58);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_60);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr(&local_58);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    FVar5 = pbrt::Blackbody(fVar1,T);
    local_58.ptr_._0_4_ = FVar5;
    local_60[0] = pbrt::Blackbody(fVar1 * 1.001,T);
    testing::internal::CmpHelperGT<float,float>
              ((internal *)&gtest_ar,"Blackbody(lambda[1], T)","Blackbody(lambda[2], T)",
               (float *)&local_58,local_60);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_58);
      pcVar3 = "";
      if (gtest_ar.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_60,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/spectrum_test.cpp"
                 ,0x2e,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_60,(Message *)&local_58);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_60);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr(&local_58);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
  }
  return;
}

Assistant:

TEST(Spectrum, Blackbody) {
    // Relative error.
    auto err = [](Float val, Float ref) { return std::abs(val - ref) / ref; };

    // Planck's law.
    // A few values via
    // http://www.spectralcalc.com/blackbody_calculator/blackbody.php
    // lambda, T, expected radiance
    Float v[][3] = {
        {483, 6000, 3.1849e13},
        {600, 6000, 2.86772e13},
        {500, 3700, 1.59845e12},
        {600, 4500, 7.46497e12},
    };
    int n = PBRT_ARRAYSIZE(v);
    for (int i = 0; i < n; ++i) {
        Float lambda = v[i][0], T = v[i][1], LeExpected = v[i][2];
        EXPECT_LT(err(Blackbody(lambda, T), LeExpected), .001);
    }

    // Use Wien's displacement law to compute maximum wavelength for a few
    // temperatures, then confirm that the value returned by Blackbody() is
    // consistent with this.
    for (Float T : {2700, 3000, 4500, 5600, 6000}) {
        Float lambdaMax = 2.8977721e-3 / T * 1e9;
        Float lambda[3] = {Float(.999 * lambdaMax), lambdaMax, Float(1.001 * lambdaMax)};
        EXPECT_LT(Blackbody(lambda[0], T), Blackbody(lambda[1], T));
        EXPECT_GT(Blackbody(lambda[1], T), Blackbody(lambda[2], T));
    }
}